

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

void __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
          (Object<(anonymous_namespace)::ObjectStruct> *this,
          Object<(anonymous_namespace)::ObjectStruct> *param_1)

{
  Object<(anonymous_namespace)::ObjectStruct> *param_1_local;
  Object<(anonymous_namespace)::ObjectStruct> *this_local;
  
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::vector(&this->Members,&param_1->Members);
  this->AnyRequired = (bool)(param_1->AnyRequired & 1);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->Error,&param_1->Error);
  this->AllowExtra = (bool)(param_1->AllowExtra & 1);
  return;
}

Assistant:

Object(JsonErrors::ObjectErrorGenerator error = JsonErrors::INVALID_OBJECT,
           bool allowExtra = true)
      : Error(std::move(error))
      , AllowExtra(allowExtra)
    {
    }